

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BP5Deserializer.cpp
# Opt level: O0

void __thiscall
adios2::format::BP5Deserializer::ReverseDimensions
          (BP5Deserializer *this,size_t *Dimensions,size_t count,size_t times)

{
  size_t sVar1;
  size_t tmp;
  size_t i;
  size_t j;
  size_t Offset;
  size_t times_local;
  size_t count_local;
  size_t *Dimensions_local;
  BP5Deserializer *this_local;
  
  Offset = 0;
  for (j = 0; j < times; j = j + 1) {
    for (i = 0; i < count >> 1; i = i + 1) {
      sVar1 = Dimensions[Offset + i];
      Dimensions[Offset + i] = Dimensions[((Offset + count) - i) + -1];
      Dimensions[((Offset + count) - i) + -1] = sVar1;
    }
    Offset = count + Offset;
  }
  return;
}

Assistant:

void BP5Deserializer::ReverseDimensions(size_t *Dimensions, size_t count, size_t times)
{
    size_t Offset = 0;
    for (size_t j = 0; j < times; j++)
    {
        for (size_t i = 0; i < count / 2; i++)
        {
            size_t tmp = Dimensions[Offset + i];
            Dimensions[Offset + i] = Dimensions[Offset + count - i - 1];
            Dimensions[Offset + count - i - 1] = tmp;
        }
        Offset += count;
    }
}